

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

void __thiscall
libtorrent::dht_get_peers_reply_alert::peers
          (dht_get_peers_reply_alert *this,
          vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          *v)

{
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  p;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  local_30;
  
  peers(&local_30,this);
  std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  ::reserve(v,((long)local_30.
                     super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_30.
                     super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>*,std::back_insert_iterator<std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>>>
            (local_30.
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_30.
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
              )v);
  if (local_30.
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (basic_endpoint<boost::asio::ip::tcp> *)0x0) {
    operator_delete(local_30.
                    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

void dht_get_peers_reply_alert::peers(std::vector<tcp::endpoint> &v) const
	{
		std::vector<tcp::endpoint> p(peers());
		v.reserve(p.size());
		std::copy(p.begin(), p.end(), std::back_inserter(v));
	}